

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseRefKind(WastParser *this,Type *out_type)

{
  char cVar1;
  TokenType TVar2;
  Result RVar3;
  long lVar4;
  allocator<char> local_c2;
  allocator<char> local_c1;
  Type type;
  Token token;
  string local_58 [32];
  string local_38;
  
  TVar2 = Peek(this,0);
  if (2 < TVar2 - First_RefKind) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&token,"func",(allocator<char> *)&type);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&token.token_type_,"extern",&local_c1);
    std::__cxx11::string::string<std::allocator<char>>(local_58,"exn",&local_c2);
    local_38._M_dataplus._M_p = (pointer)0x0;
    local_38._M_string_length = 0;
    local_38.field_2._M_allocated_capacity = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_38,&token
               ,&local_38);
    RVar3 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&local_38,(char *)0x0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_38);
    lVar4 = 0x40;
    do {
      std::__cxx11::string::_M_dispose();
      lVar4 = lVar4 + -0x20;
    } while (lVar4 != -0x20);
    return (Result)RVar3.enum_;
  }
  Consume(&token,this);
  type = Token::type(&token);
  if ((uint)(type.enum_ + 0x22) < 2) {
    cVar1 = (this->options_->features).gc_enabled_;
  }
  else {
    if (type.enum_ != ExternRef) goto LAB_0012d155;
    cVar1 = (this->options_->features).reference_types_enabled_;
  }
  if (cVar1 == '\0') {
    Type::GetName_abi_cxx11_(&local_38,&type);
    Error(this,0x166de2,local_38._M_dataplus._M_p);
    std::__cxx11::string::_M_dispose();
    return (Result)Error;
  }
LAB_0012d155:
  *out_type = type;
  return (Result)Ok;
}

Assistant:

Result WastParser::ParseRefKind(Type* out_type) {
  WABT_TRACE(ParseRefKind);
  if (!IsTokenTypeRefKind(Peek())) {
    return ErrorExpected({"func", "extern", "exn"});
  }

  Token token = Consume();
  Type type = token.type();

  if ((type == Type::ExternRef &&
       !options_->features.reference_types_enabled()) ||
      ((type == Type::Struct || type == Type::Array) &&
       !options_->features.gc_enabled())) {
    Error(token.loc, "value type not allowed: %s", type.GetName().c_str());
    return Result::Error;
  }

  *out_type = type;
  return Result::Ok;
}